

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauDsd.c
# Opt level: O0

void Dau_DsdWriteVar(Dau_Dsd_t *p,int iVar,int fInv)

{
  char cVar1;
  int iVar2;
  char (*local_20) [8];
  char *pStr;
  int fInv_local;
  int iVar_local;
  Dau_Dsd_t *p_local;
  
  if (fInv != 0) {
    iVar2 = p->nPos;
    p->nPos = iVar2 + 1;
    p->pOutput[iVar2] = '!';
  }
  for (local_20 = p->pVarDefs + iVar; (*local_20)[0] != '\0';
      local_20 = (char (*) [8])(*local_20 + 1)) {
    if (((int)(*local_20)[0] < p->nVarsInit + 0x61) || (p->nVarsUsed + 0x61 <= (int)(*local_20)[0]))
    {
      cVar1 = (*local_20)[0];
      iVar2 = p->nPos;
      p->nPos = iVar2 + 1;
      p->pOutput[iVar2] = cVar1;
    }
    else {
      Dau_DsdWriteVar(p,(*local_20)[0] + -0x61,0);
    }
  }
  return;
}

Assistant:

static inline void Dau_DsdWriteVar( Dau_Dsd_t * p, int iVar, int fInv )
{
    char * pStr;
    if ( fInv )
        p->pOutput[ p->nPos++ ] = '!';
    for ( pStr = p->pVarDefs[iVar]; *pStr; pStr++ )
        if ( *pStr >= 'a' + p->nVarsInit && *pStr < 'a' + p->nVarsUsed )
            Dau_DsdWriteVar( p, *pStr - 'a', 0 );
        else
            p->pOutput[ p->nPos++ ] = *pStr;
}